

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall
gl4cts::FunctionObject::unary<double,_tcu::Matrix<double,_2,_2>_>::call
          (unary<double,_tcu::Matrix<double,_2,_2>_> *this,GLvoid *result_dst,GLvoid *argument_src)

{
  undefined4 *puVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  uint uVar11;
  Matrix<double,_2,_2> arg;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  puVar6 = &local_28;
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  lVar8 = 0;
  lVar7 = 0;
  do {
    lVar9 = 0;
    do {
      uVar11 = 0x3ff00000;
      if (lVar8 != lVar9) {
        uVar11 = 0;
      }
      *(ulong *)((long)puVar6 + lVar9) = (ulong)uVar11 << 0x20;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 == 0x10);
    puVar6 = (undefined8 *)((long)puVar6 + 8);
    lVar8 = lVar8 + 0x10;
    bVar10 = lVar7 == 0;
    lVar7 = lVar7 + 1;
  } while (bVar10);
  lVar7 = 0;
  do {
    puVar1 = (undefined4 *)((long)argument_src + lVar7);
    uVar3 = puVar1[1];
    uVar4 = puVar1[2];
    uVar5 = puVar1[3];
    *(undefined4 *)((long)&local_28 + lVar7) = *puVar1;
    *(undefined4 *)((long)&local_28 + lVar7 + 4) = uVar3;
    *(undefined4 *)((long)&uStack_20 + lVar7) = uVar4;
    *(undefined4 *)((long)&uStack_20 + lVar7 + 4) = uVar5;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 == 0x10);
  uVar2 = (*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(&local_28);
  *(undefined8 *)result_dst = uVar2;
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}